

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guess_basis.cc
# Opt level: O1

vector<int,_std::allocator<int>_> *
ipx::GuessBasis(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Control *control,
               Model *model,double *colweights)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  iterator iVar8;
  pointer piVar9;
  int *__first;
  vector<int,std::allocator<int>> *this;
  Int *pIVar10;
  pointer marked_00;
  pointer piVar11;
  double dVar12;
  bool bVar13;
  char cVar14;
  Int top;
  void *__s;
  ostream *poVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  size_type sVar20;
  long lVar21;
  size_type __n;
  pointer piVar22;
  uint uVar23;
  long lVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  int local_218;
  char local_211;
  vector<int,std::allocator<int>> *local_210;
  string local_208;
  Int *local_1e8;
  double *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  int local_1bc;
  vector<int,_std::allocator<int>_> work;
  vector<int,_std::allocator<int>_> pattern;
  SparseMatrix L;
  vector<int,_std::allocator<int>_> marked;
  vector<int,_std::allocator<int>_> rownumber;
  vector<int,_std::allocator<int>_> active;
  vector<int,_std::allocator<int>_> cheap;
  vector<int,_std::allocator<int>_> work3;
  vector<int,_std::allocator<int>_> work2;
  vector<int,_std::allocator<int>_> work_1;
  
  iVar1 = model->num_rows_;
  iVar2 = model->num_cols_;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  L.nrow_ = -1;
  local_210 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  local_1e0 = colweights;
  std::vector<int,_std::allocator<int>_>::vector
            (&rownumber,(long)iVar1,&L.nrow_,(allocator_type *)&local_208);
  L.nrow_ = 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&active,(long)(iVar2 + iVar1),&L.nrow_,(allocator_type *)&local_208);
  piVar11 = active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar6 = rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar19 = model->num_rows_;
  sVar20 = (size_type)iVar19;
  iVar18 = model->num_cols_;
  std::vector<int,_std::allocator<int>_>::vector(&pattern,sVar20,(allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work,sVar20,(allocator_type *)&L);
  L.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&marked,sVar20,&L.nrow_,(allocator_type *)&local_208);
  __s = operator_new(sVar20 * 8);
  local_1e8 = piVar6;
  local_218 = 0;
  memset(__s,0,sVar20 * 8);
  SparseMatrix::SparseMatrix(&L,iVar19,0);
  local_208._M_dataplus._M_p._0_4_ = 0;
  iVar16 = iVar18 + iVar19;
  if (iVar16 != 0 && SCARRY4(iVar18,iVar19) == iVar16 < 0) {
    local_218 = 0;
    local_1bc = iVar16;
    do {
      marked_00 = marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      piVar9 = L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar22 = L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      iVar19 = (int)local_208._M_dataplus._M_p;
      lVar24 = (long)(int)local_208._M_dataplus._M_p;
      if (INFINITY <= local_1e0[lVar24]) {
        piVar5 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar18 = piVar5[lVar24];
        lVar21 = (long)iVar18;
        top = L.nrow_;
        if (iVar18 < piVar5[lVar24 + 1]) {
          local_1d8 = pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          do {
            iVar18 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar21];
            if (marked_00[iVar18] != iVar19) {
              top = DepthFirstSearch(iVar18,piVar22,piVar9,local_1e8,top,local_1d8,marked_00,iVar19,
                                     piVar6);
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar24 + 1]);
        }
        pIVar10 = local_1e8;
        if (top < L.nrow_) {
          lVar24 = (long)top;
          do {
            *(undefined8 *)
             ((long)__s +
             (long)pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar24] * 8) = 0;
            lVar24 = lVar24 + 1;
          } while (L.nrow_ != lVar24);
        }
        piVar6 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar19 = piVar6[(int)local_208._M_dataplus._M_p];
        lVar24 = (long)iVar19;
        iVar18 = piVar6[(long)(int)local_208._M_dataplus._M_p + 1];
        if (iVar19 < iVar18) {
          piVar6 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7 = (model->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            *(double *)((long)__s + (long)piVar6[lVar24] * 8) = pdVar7[lVar24];
            lVar24 = lVar24 + 1;
          } while (iVar18 != lVar24);
        }
        uVar23 = 0xffffffff;
        if (top < L.nrow_) {
          lVar24 = (long)top;
          dVar25 = 0.0;
          do {
            uVar3 = pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar24];
            dVar26 = *(double *)((long)__s + (long)(int)uVar3 * 8);
            if ((dVar26 != 0.0) || (NAN(dVar26))) {
              uVar4 = local_1e8[(int)uVar3];
              if ((int)uVar4 < 0) {
                if (dVar25 < ABS(dVar26)) {
                  dVar25 = ABS(dVar26);
                  uVar23 = uVar3;
                }
              }
              else {
                lVar21 = (long)L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar4];
                iVar19 = L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(ulong)uVar4 + 1];
                if (L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4] < iVar19) {
                  do {
                    *(double *)
                     ((long)__s +
                     (long)L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar21] * 8) =
                         *(double *)
                          ((long)__s +
                          (long)L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar21] * 8) -
                         L.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar21] * dVar26;
                    lVar21 = lVar21 + 1;
                  } while (iVar19 != lVar21);
                }
              }
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != L.nrow_);
        }
        if ((int)uVar23 < 0) {
          local_1d8 = (Int *)0x0;
        }
        else {
          local_1d8 = *(Int **)((long)__s + (ulong)uVar23 * 8);
        }
        uStack_1d0 = 0;
        if (0.001 < ABS((double)local_1d8)) {
          iVar8._M_current = *(int **)(local_210 + 8);
          local_1e8[(int)uVar23] = (Int)((ulong)((long)iVar8._M_current - *(long *)local_210) >> 2);
          if (iVar8._M_current == *(int **)(local_210 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_210,iVar8,(int *)&local_208);
          }
          else {
            *iVar8._M_current = (int)local_208._M_dataplus._M_p;
            *(int **)(local_210 + 8) = iVar8._M_current + 1;
          }
          piVar6 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar19 = piVar6[(int)local_208._M_dataplus._M_p];
          lVar24 = (long)iVar19;
          if (iVar19 < piVar6[(long)(int)local_208._M_dataplus._M_p + 1]) {
            do {
              iVar19 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar24];
              if (pIVar10[iVar19] < 0) {
                dVar25 = *(double *)((long)__s + (long)iVar19 * 8);
                if ((dVar25 != 0.0) || (NAN(dVar25))) {
                  SparseMatrix::push_back(&L,iVar19,dVar25 / (double)local_1d8);
                }
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 < (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start
                              [(long)(int)local_208._M_dataplus._M_p + 1]);
          }
          SparseMatrix::add_column(&L);
          local_218 = local_218 + 1;
        }
        piVar11[(int)local_208._M_dataplus._M_p] = 0;
        iVar16 = local_1bc;
      }
      local_208._M_dataplus._M_p._0_4_ = (int)local_208._M_dataplus._M_p + 1;
    } while ((int)local_208._M_dataplus._M_p < iVar16);
  }
  poVar15 = Control::Debug(control,1);
  Textline<char[44]>(&local_208,(char (*) [44])"Number of free variables in starting basis:");
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,(char *)CONCAT44(local_208._M_dataplus._M_p._4_4_,
                                                (int)local_208._M_dataplus._M_p),
                       local_208._M_string_length);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_218);
  cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_1_
       = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&cheap,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_208._M_dataplus._M_p._4_4_,(int)local_208._M_dataplus._M_p) !=
      &local_208.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_208._M_dataplus._M_p._4_4_,(int)local_208._M_dataplus._M_p));
  }
  if (L.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(L.values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (L.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(L.rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (L.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(L.values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(L.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  operator_delete(__s);
  if (marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  piVar11 = active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar6 = rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar19 = model->num_rows_;
  if ((long)iVar19 < 1) {
    iVar18 = 0;
  }
  else {
    lVar24 = 0;
    iVar18 = 0;
    do {
      if (piVar6[lVar24] < 0) {
        L.nrow_ = -1;
        piVar22 = (model->AIt_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar21 = (long)piVar22[lVar24];
        dVar26 = 0.0;
        dVar25 = 0.0;
        if (piVar22[lVar24] < piVar22[lVar24 + 1]) {
          piVar9 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar16 = (model->AIt_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar21];
            if (piVar11[iVar16] != 0) {
              dVar27 = ABS((model->AIt_).values_.super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar21]) * local_1e0[iVar16];
              dVar12 = dVar27;
              if (dVar27 <= dVar26) {
                dVar12 = dVar26;
              }
              dVar26 = dVar12;
              if ((dVar25 < dVar27) && (piVar9[(long)iVar16 + 1] == piVar9[iVar16] + 1)) {
                dVar25 = dVar27;
                L.nrow_ = iVar16;
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < piVar22[lVar24 + 1]);
          dVar26 = dVar26 * 0.5;
        }
        if ((0.0 < dVar25) && (dVar26 <= dVar25)) {
          iVar8._M_current = *(int **)(local_210 + 8);
          piVar6[lVar24] = (int)((ulong)((long)iVar8._M_current - *(long *)local_210) >> 2);
          if (iVar8._M_current == *(int **)(local_210 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_210,iVar8,&L.nrow_);
          }
          else {
            *iVar8._M_current = L.nrow_;
            *(int **)(local_210 + 8) = iVar8._M_current + 1;
          }
          piVar11[L.nrow_] = 0;
          iVar18 = iVar18 + 1;
        }
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != iVar19);
  }
  poVar15 = Control::Debug(control,1);
  Textline<char[40]>((string *)&L,(char (*) [40])"Number of singletons in starting basis:");
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,(char *)CONCAT44(L._4_4_,L.nrow_),
                       (long)L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar18);
  local_208._M_dataplus._M_p._0_4_ = CONCAT31(local_208._M_dataplus._M_p._1_3_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&local_208,1);
  if ((pointer *)CONCAT44(L._4_4_,L.nrow_) !=
      &L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish) {
    operator_delete((undefined1 *)CONCAT44(L._4_4_,L.nrow_));
  }
  piVar11 = active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar6 = rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar23 = model->num_rows_;
  __n = (size_type)(int)uVar23;
  iVar19 = model->num_cols_;
  sVar20 = (long)iVar19 + __n;
  Sortperm(&pattern,(Int)sVar20,local_1e0,true);
  L.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector(&work,__n,&L.nrow_,(allocator_type *)&local_208);
  if (0 < (int)uVar23) {
    uVar17 = 0;
    do {
      if (-1 < piVar6[uVar17]) {
        work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar17] = -2;
      }
      uVar17 = uVar17 + 1;
    } while (uVar23 != uVar17);
  }
  L.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&marked,sVar20,&L.nrow_,(allocator_type *)&local_208);
  __first = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1e8 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&cheap,__first,__first + (long)iVar19 + __n,
             (allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work_1,__n,(allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work2,__n + 1,(allocator_type *)&L);
  std::vector<int,_std::allocator<int>_>::vector(&work3,__n + 1,(allocator_type *)&L);
  if (pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    local_1d8 = (Int *)((ulong)local_1d8._4_4_ << 0x20);
    iVar19 = 0;
  }
  else {
    iVar19 = 0;
    local_1d8 = (Int *)((ulong)local_1d8._4_4_ << 0x20);
    piVar22 = pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
    do {
      L.nrow_ = *piVar22;
      if (piVar11[L.nrow_] == 0) {
        cVar14 = '\x06';
      }
      else {
        cVar14 = '\x05';
        if ((local_1e0[L.nrow_] != 0.0) || (NAN(local_1e0[L.nrow_]))) {
          bVar13 = AugmentingPath(L.nrow_,__first,local_1e8,
                                  work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (Int *)CONCAT71(cheap.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  cheap.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_1_),
                                  marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  work2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  work3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          if (bVar13) {
            iVar8._M_current = *(int **)(local_210 + 8);
            if (iVar8._M_current == *(int **)(local_210 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_210,iVar8,&L.nrow_);
            }
            else {
              *iVar8._M_current = L.nrow_;
              *(int **)(local_210 + 8) = iVar8._M_current + 1;
            }
            local_1d8 = (Int *)CONCAT44(local_1d8._4_4_,(int)local_1d8 + 1);
          }
          else {
            iVar19 = iVar19 + 1;
          }
          iVar18 = uVar23 - (int)((ulong)((long)*(pointer *)(local_210 + 8) - *(long *)local_210) >>
                                 2);
          cVar14 = (SBORROW4(iVar19,iVar18 * 10) == iVar19 + iVar18 * -10 < 0) * '\x05';
        }
      }
    } while (((cVar14 == '\x06') || (cVar14 == '\0')) &&
            (piVar22 = piVar22 + 1,
            piVar22 !=
            pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish));
  }
  if (0 < (int)uVar23) {
    uVar17 = 0;
    do {
      if (-1 < work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar17]) {
        piVar6[uVar17] = uVar23;
      }
      uVar17 = uVar17 + 1;
    } while (uVar23 != uVar17);
  }
  poVar15 = Control::Debug(control,1);
  this = local_210;
  Textline<char[33]>((string *)&L,(char (*) [33])"Number of other columns matched:");
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,(char *)CONCAT44(L._4_4_,L.nrow_),
                       (long)L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,(int)local_1d8);
  local_208._M_dataplus._M_p._0_4_ = CONCAT31(local_208._M_dataplus._M_p._1_3_,10);
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)&local_208,1);
  Textline<char[32]>(&local_208,(char (*) [32])"Number of other columns failed:");
  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,(char *)CONCAT44(local_208._M_dataplus._M_p._4_4_,
                                                (int)local_208._M_dataplus._M_p),
                       local_208._M_string_length);
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar19);
  local_211 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,&local_211,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_208._M_dataplus._M_p._4_4_,(int)local_208._M_dataplus._M_p) !=
      &local_208.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_208._M_dataplus._M_p._4_4_,(int)local_208._M_dataplus._M_p));
  }
  if ((pointer *)CONCAT44(L._4_4_,L.nrow_) !=
      &L.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish) {
    operator_delete((undefined1 *)CONCAT44(L._4_4_,L.nrow_));
  }
  if (work3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(work3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (work2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(work2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT71(cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._1_7_,
                       cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._1_7_,
                                     cheap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_1_));
  }
  if (marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(pattern.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (0 < iVar1) {
    sVar20 = 0;
    do {
      if (rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar20] < 0) {
        L.nrow_ = iVar2 + (int)sVar20;
        iVar8._M_current = *(int **)(this + 8);
        if (iVar8._M_current == *(int **)(this + 0x10)) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)this,iVar8,&L.nrow_);
        }
        else {
          *iVar8._M_current = iVar2 + (int)sVar20;
          *(int **)(this + 8) = iVar8._M_current + 1;
        }
      }
      sVar20 = sVar20 + 1;
    } while ((long)iVar1 != sVar20);
  }
  if (active.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(active.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(rownumber.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (vector<int,_std::allocator<int>_> *)this;
}

Assistant:

std::vector<Int> GuessBasis(const Control& control, const Model& model,
                            const double* colweights) {
    const Int m = model.rows();
    const Int n = model.cols();

    // basis starts empty and is filled one index at a time. rownumber[i] >= 0
    // iff row i was pivot row when a column was added to the basis. (The
    // specific value has a different meaning in each method.) A column is
    // "active" if it is eligible for being added to the basis.
    std::vector<Int> basis, rownumber(m, -1);
    std::vector<int> active(n+m, 1);

    ProcessFreeColumns(control, model, colweights, &basis, rownumber.data(),
                       active.data());
    ProcessSingletons(control, model, colweights, &basis, rownumber.data(),
                      active.data());
    ProcessRemaining(control, model, colweights, &basis, rownumber.data(),
                     active.data());

    // Complete basis with unit columns.
    for (Int i = 0; i < m; i++) {
        if (rownumber[i] < 0)
            basis.push_back(n+i);
    }
    assert((Int)basis.size() == m);
    return basis;
}